

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

void __thiscall
kj::_::Delimited<kj::ArrayPtr<void_*const>_&>::~Delimited
          (Delimited<kj::ArrayPtr<void_*const>_&> *this)

{
  CappedArray<char,_17UL> *pCVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pCVar1 = (this->stringified).ptr;
  if (pCVar1 != (CappedArray<char,_17UL> *)0x0) {
    sVar2 = (this->stringified).size_;
    (this->stringified).ptr = (CappedArray<char,_17UL> *)0x0;
    (this->stringified).size_ = 0;
    pAVar3 = (this->stringified).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pCVar1,0x20,sVar2,sVar2,0);
  }
  return;
}

Assistant:

Delimited(T array, kj::StringPtr delimiter)
      : array(kj::fwd<T>(array)), delimiter(delimiter) {}